

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_binary_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op,BaseType input_type,bool skip_cast_if_equal_type,bool implicit_integer_promotion)

{
  bool bVar1;
  uint32_t result_type_00;
  bool bVar2;
  SPIRType *pSVar3;
  __node_base_ptr *pp_Var4;
  uint32_t uVar5;
  undefined4 in_stack_fffffffffffffd0c;
  bool local_2e5;
  undefined1 local_2a2;
  undefined1 local_2a1 [33];
  string local_280;
  undefined1 local_25a;
  undefined1 local_259 [33];
  string local_238;
  undefined1 local_218 [8];
  string expr;
  string bitop;
  SPIRType *out_type;
  undefined1 local_1c0 [8];
  SPIRType expected_type;
  string cast_op1;
  string cast_op0;
  bool implicit_integer_promotion_local;
  char *pcStack_28;
  bool skip_cast_if_equal_type_local;
  char *op_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  bVar1 = implicit_integer_promotion;
  bVar2 = skip_cast_if_equal_type;
  pcStack_28 = op;
  op_local._0_4_ = op1;
  op_local._4_4_ = op0;
  op1_local = result_id;
  op0_local = result_type;
  _result_id_local = this;
  ::std::__cxx11::string::string((string *)(cast_op1.field_2._M_local_buf + 8));
  pp_Var4 = &expected_type.member_name_cache._M_h._M_single_bucket;
  ::std::__cxx11::string::string((string *)pp_Var4);
  uVar5 = (uint32_t)op_local;
  binary_op_bitcast_helper
            ((SPIRType *)local_1c0,this,(string *)(cast_op1.field_2._M_local_buf + 8),
             (string *)pp_Var4,&input_type,op_local._4_4_,(uint32_t)op_local,bVar2);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,op0_local);
  pp_Var4 = &expected_type.member_name_cache._M_h._M_single_bucket;
  join<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&>
            ((string *)((long)&expr.field_2 + 8),(spirv_cross *)(cast_op1.field_2._M_local_buf + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x645fd9,
             (char (*) [2])&stack0xffffffffffffffd8,(char **)0x645fd9,(char (*) [2])pp_Var4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd0c,uVar5));
  ::std::__cxx11::string::string((string *)local_218);
  if (bVar1) {
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_259 + 1,this,pSVar3,0);
    local_259[0] = (_Alloc_hider)0x28;
    local_25a = (_Alloc_hider)0x29;
    join<std::__cxx11::string,char,std::__cxx11::string&,char>
              (&local_238,(spirv_cross *)(local_259 + 1),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_259,
               expr.field_2._M_local_buf + 8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_25a,
               (char *)pp_Var4);
    ::std::__cxx11::string::operator=((string *)local_218,(string *)&local_238);
    ::std::__cxx11::string::~string((string *)&local_238);
    ::std::__cxx11::string::~string((string *)(local_259 + 1));
  }
  else if ((pSVar3->basetype == input_type) || (pSVar3->basetype == Boolean)) {
    ::std::__cxx11::string::operator=((string *)local_218,(string *)(expr.field_2._M_local_buf + 8))
    ;
  }
  else {
    expected_type.super_IVariant.self.id = input_type;
    (*(this->super_Compiler)._vptr_Compiler[0x3b])(local_2a1 + 1,this,pSVar3,local_1c0);
    local_2a1[0] = (_Alloc_hider)0x28;
    local_2a2 = (_Alloc_hider)0x29;
    join<std::__cxx11::string,char,std::__cxx11::string&,char>
              (&local_280,(spirv_cross *)(local_2a1 + 1),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a1,
               expr.field_2._M_local_buf + 8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a2,
               (char *)pp_Var4);
    ::std::__cxx11::string::operator=((string *)local_218,(string *)&local_280);
    ::std::__cxx11::string::~string((string *)&local_280);
    ::std::__cxx11::string::~string((string *)(local_2a1 + 1));
  }
  result_type_00 = op0_local;
  uVar5 = op1_local;
  bVar2 = should_forward(this,op_local._4_4_);
  local_2e5 = false;
  if (bVar2) {
    local_2e5 = should_forward(this,(uint32_t)op_local);
  }
  emit_op(this,result_type_00,uVar5,(string *)local_218,local_2e5,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,op_local._4_4_);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,(uint32_t)op_local);
  ::std::__cxx11::string::~string((string *)local_218);
  ::std::__cxx11::string::~string((string *)(expr.field_2._M_local_buf + 8));
  SPIRType::~SPIRType((SPIRType *)local_1c0);
  ::std::__cxx11::string::~string((string *)&expected_type.member_name_cache._M_h._M_single_bucket);
  ::std::__cxx11::string::~string((string *)(cast_op1.field_2._M_local_buf + 8));
  return;
}

Assistant:

void CompilerGLSL::emit_binary_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                       const char *op, SPIRType::BaseType input_type,
                                       bool skip_cast_if_equal_type,
                                       bool implicit_integer_promotion)
{
	string cast_op0, cast_op1;
	auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, op0, op1, skip_cast_if_equal_type);
	auto &out_type = get<SPIRType>(result_type);

	// We might have casted away from the result type, so bitcast again.
	// For example, arithmetic right shift with uint inputs.
	// Special case boolean outputs since relational opcodes output booleans instead of int/uint.
	auto bitop = join(cast_op0, " ", op, " ", cast_op1);
	string expr;

	if (implicit_integer_promotion)
	{
		// Simple value cast.
		expr = join(type_to_glsl(out_type), '(', bitop, ')');
	}
	else if (out_type.basetype != input_type && out_type.basetype != SPIRType::Boolean)
	{
		expected_type.basetype = input_type;
		expr = join(bitcast_glsl_op(out_type, expected_type), '(', bitop, ')');
	}
	else
	{
		expr = std::move(bitop);
	}

	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1));
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}